

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_hash.c
# Opt level: O1

ion_err_t oah_initialize(ion_hashmap_t *hashmap,
                        _func_ion_hash_t_ion_hashmap_t_ptr_ion_key_t_int *hashing_function,
                        ion_key_type_t key_type,ion_key_size_t key_size,ion_value_size_t value_size,
                        int size)

{
  int iVar1;
  char *pcVar2;
  
  hashmap->write_concern = '\x01';
  (hashmap->super).record.key_size = key_size;
  (hashmap->super).record.value_size = value_size;
  (hashmap->super).key_type = key_type;
  hashmap->map_size = size;
  pcVar2 = (char *)malloc((long)((key_size + value_size + 1) * size));
  hashmap->entry = pcVar2;
  hashmap->compute_hash = (_func_int_ion_hashmap_t_ptr_ion_key_t_int *)hashing_function;
  if (pcVar2 == (char *)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
    if (0 < size) {
      do {
        hashmap->entry
        [((hashmap->super).record.key_size + (hashmap->super).record.value_size + 1) * iVar1] = -1;
        iVar1 = iVar1 + 1;
      } while (size != iVar1);
      iVar1 = 0;
    }
  }
  return (ion_err_t)iVar1;
}

Assistant:

ion_err_t
oah_initialize(
	ion_hashmap_t *hashmap,
	ion_hash_t (*hashing_function)(ion_hashmap_t *, ion_key_t, int),
	ion_key_type_t key_type,
	ion_key_size_t key_size,
	ion_value_size_t value_size,
	int size
) {
	int i;

	hashmap->write_concern				= wc_insert_unique;			/* By default allow unique inserts only */
	hashmap->super.record.key_size		= key_size;
	hashmap->super.record.value_size	= value_size;
	hashmap->super.key_type				= key_type;

/*	hashmap->compare = compare;*/

	/* The hash map is allocated as a single contiguous array*/
	hashmap->map_size		= size;
	hashmap->entry			= malloc((hashmap->super.record.key_size + hashmap->super.record.value_size + 1) * hashmap->map_size);
	/* Allows for binding of different hash function depending on requirements. */
	hashmap->compute_hash	= (*hashing_function);

	if (NULL == hashmap->entry) {
		return 1;
	}

#if ION_DEBUG
	printf("Initializing hash table\n");
#endif

	/* Initialize hash table */
	for (i = 0; i < size; i++) {
		((ion_hash_bucket_t *) (hashmap->entry + ((hashmap->super.record.key_size + hashmap->super.record.value_size + SIZEOF(STATUS)) * i)))->status = ION_EMPTY;
	}

	return 0;
}